

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

optional<std::pair<unsigned_int,_int>_>
miniscript::internal::ParseKeyEnd<unsigned_int,(anonymous_namespace)::KeyParser>
          (Span<const_char> in,KeyParser *ctx)

{
  long lVar1;
  undefined4 extraout_var;
  optional<unsigned_int> oVar2;
  _Storage<std::pair<unsigned_int,_int>,_true> _Var3;
  uint uVar4;
  char in_CL;
  internal *this;
  long in_FS_OFFSET;
  Span<const_char> sp;
  optional<std::pair<unsigned_int,_int>_> oVar5;
  
  sp.m_data = (char *)in.m_size;
  this = (internal *)in.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 0x29;
  _Var3._0_4_ = FindNextChar(this,sp,in_CL);
  _Var3._M_value.second = extraout_var;
  if ((int)_Var3._0_4_ < 1) {
    uVar4 = 0;
  }
  else {
    oVar2 = (anonymous_namespace)::KeyParser::FromString<char_const*>
                      ((KeyParser *)ctx,(char *)this,(char *)(this + _Var3._0_4_));
    _Var3 = (_Storage<std::pair<unsigned_int,_int>,_true>)
            ((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0xffffffff |
            (ulong)_Var3._0_4_ << 0x20);
    uVar4 = oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._4_4_ & 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar5.super__Optional_base<std::pair<unsigned_int,_int>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<unsigned_int,_int>_>._8_4_ = uVar4;
    oVar5.super__Optional_base<std::pair<unsigned_int,_int>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<unsigned_int,_int>_>._M_payload = _Var3;
    return (optional<std::pair<unsigned_int,_int>_>)
           oVar5.super__Optional_base<std::pair<unsigned_int,_int>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<unsigned_int,_int>_>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<Key, int>> ParseKeyEnd(Span<const char> in, const Ctx& ctx)
{
    int key_size = FindNextChar(in, ')');
    if (key_size < 1) return {};
    auto key = ctx.FromString(in.begin(), in.begin() + key_size);
    if (!key) return {};
    return {{std::move(*key), key_size}};
}